

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O3

void __thiscall
CaDiCaL::heap<CaDiCaL::block_more_occs_size>::down(heap<CaDiCaL::block_more_occs_size> *this,uint e)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint b;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  pointer plVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  bVar3 = has_left(this,e);
  if (bVar3) {
    uVar2 = e >> 1;
    uVar5 = -uVar2;
    if ((e & 1) == 0) {
      uVar5 = uVar2;
    }
    do {
      b = left(this,e);
      bVar3 = has_right(this,e);
      if (bVar3) {
        uVar4 = right(this,e);
        uVar8 = b >> 1;
        uVar10 = -uVar8;
        uVar9 = b & 1;
        uVar1 = uVar10;
        if (uVar9 == 0) {
          uVar1 = uVar8;
        }
        uVar6 = uVar4 >> 1;
        uVar11 = -uVar6;
        if ((uVar4 & 1) == 0) {
          uVar11 = uVar6;
        }
        plVar7 = (((this->less).internal)->ntab).super__Vector_base<long,_std::allocator<long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((ulong)plVar7[-uVar11 >> 0x1f | uVar6 << 1] <
             (ulong)plVar7[-uVar1 >> 0x1f | uVar8 << 1]) ||
           (((ulong)plVar7[-uVar11 >> 0x1f | uVar6 << 1] <=
             (ulong)plVar7[-uVar1 >> 0x1f | uVar8 << 1] &&
            (((ulong)plVar7[uVar11 >> 0x1f | uVar6 << 1] < (ulong)plVar7[uVar1 >> 0x1f | uVar8 << 1]
             || ((uVar4 < b &&
                 ((ulong)plVar7[uVar11 >> 0x1f | uVar6 << 1] <=
                  (ulong)plVar7[uVar1 >> 0x1f | uVar8 << 1])))))))) {
          b = uVar4;
          uVar8 = uVar6;
          uVar10 = -uVar6;
          uVar9 = uVar4 & 1;
        }
      }
      else {
        plVar7 = (((this->less).internal)->ntab).super__Vector_base<long,_std::allocator<long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = b >> 1;
        uVar10 = -(b >> 1);
        uVar9 = b & 1;
      }
      if (uVar9 == 0) {
        uVar10 = uVar8;
      }
      if ((ulong)plVar7[-uVar5 >> 0x1f | uVar2 << 1] <= (ulong)plVar7[-uVar10 >> 0x1f | uVar8 << 1])
      {
        if ((ulong)plVar7[-uVar5 >> 0x1f | uVar2 << 1] < (ulong)plVar7[-uVar10 >> 0x1f | uVar8 << 1]
           ) {
          return;
        }
        if ((ulong)plVar7[uVar5 >> 0x1f | uVar2 << 1] <= (ulong)plVar7[uVar8 << 1 | uVar10 >> 0x1f])
        {
          if (e <= b) {
            return;
          }
          if ((ulong)plVar7[uVar5 >> 0x1f | uVar2 << 1] < (ulong)plVar7[uVar8 << 1 | uVar10 >> 0x1f]
             ) {
            return;
          }
        }
      }
      exchange(this,e,b);
      bVar3 = has_left(this,e);
    } while (bVar3);
  }
  return;
}

Assistant:

void down (unsigned e) {
    while (has_left (e)) {
      unsigned c = left (e);
      if (has_right (e)) {
        unsigned r = right (e);
        if (less (c, r))
          c = r;
      }
      if (!less (e, c))
        break;
      exchange (e, c);
    }
  }